

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc_kernel.cxx
# Opt level: O1

void __thiscall ExchCXX::XCKernel::XCKernel(XCKernel *this,libxc_name_string *xc_name,Spin polar)

{
  pointer pcVar1;
  pointer *__ptr;
  _Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false> local_48;
  string local_40;
  
  pcVar1 = (xc_name->value_)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (xc_name->value_)._M_string_length);
  libxc_kernel_factory((ExchCXX *)&local_48,&local_40,polar);
  (this->pimpl_)._M_t.
  super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
  .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl =
       local_48._M_head_impl;
  local_48._M_head_impl = (XCKernelImpl *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

XCKernel::XCKernel(
  const libxc_name_string& xc_name,
  const Spin polar) :
XCKernel( libxc_kernel_factory( xc_name.get(), polar ) ) { }